

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O3

string_t duckdb::Base64EncodeOperator::Operation<duckdb::string_t,duckdb::string_t>
                   (string_t input,Vector *result)

{
  Vector *vector;
  ulong uVar1;
  char *in_RCX;
  idx_t len;
  undefined1 *puVar2;
  string_t sVar3;
  string_t blob;
  string_t result_str;
  undefined1 local_28 [16];
  
  blob.value._0_8_ = input.value._8_8_;
  vector = (Vector *)Blob::ToBase64Size(input);
  local_28 = (undefined1  [16])StringVector::EmptyString((StringVector *)result,vector,len);
  puVar2 = local_28._8_8_;
  if (local_28._0_4_ < 0xd) {
    puVar2 = local_28 + 4;
  }
  blob.value.pointer.ptr = puVar2;
  Blob::ToBase64(input.value._0_8_,blob,in_RCX);
  uVar1 = (ulong)(uint)local_28._0_4_;
  if (uVar1 < 0xd) {
    switchD_010444a0::default(local_28 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_28._4_4_ = *(undefined4 *)local_28._8_8_;
  }
  sVar3.value.pointer.ptr = (char *)local_28._8_8_;
  sVar3.value._0_8_ = local_28._0_8_;
  return (string_t)sVar3.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto result_str = StringVector::EmptyString(result, Blob::ToBase64Size(input));
		Blob::ToBase64(input, result_str.GetDataWriteable());
		result_str.Finalize();
		return result_str;
	}